

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O0

void __thiscall
Reflection::StructImpl<Apple::II::Machine::Options>::declare_emplace<Configurable::Display>
          (StructImpl<Apple::II::Machine::Options> *this,Display *t,string *name,size_t count)

{
  Field local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Apple::II::Machine::Options>::Field>
  local_68;
  size_t local_28;
  size_t count_local;
  string *name_local;
  Display *t_local;
  StructImpl<Apple::II::Machine::Options> *this_local;
  
  local_28 = count;
  count_local = (size_t)name;
  name_local = (string *)t;
  t_local = (Display *)this;
  Field::Field(&local_88,(type_info *)&Configurable::Display::typeinfo,(long)t - (long)this,4,count)
  ;
  std::
  make_pair<std::__cxx11::string_const&,Reflection::StructImpl<Apple::II::Machine::Options>::Field>
            (&local_68,name,&local_88);
  std::
  unordered_map<std::__cxx11::string,Reflection::StructImpl<Apple::II::Machine::Options>::Field,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Reflection::StructImpl<Apple::II::Machine::Options>::Field>>>
  ::
  emplace<std::pair<std::__cxx11::string,Reflection::StructImpl<Apple::II::Machine::Options>::Field>>
            ((unordered_map<std::__cxx11::string,Reflection::StructImpl<Apple::II::Machine::Options>::Field,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Reflection::StructImpl<Apple::II::Machine::Options>::Field>>>
              *)&contents__abi_cxx11_,&local_68);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Apple::II::Machine::Options>::Field>
  ::~pair(&local_68);
  return;
}

Assistant:

void declare_emplace(Type *t, const std::string &name, size_t count = 1) {
			contents_.emplace(
				std::make_pair(
					name,
					Field(typeid(Type), reinterpret_cast<uint8_t *>(t) - reinterpret_cast<uint8_t *>(this), sizeof(Type), count)
				));
		}